

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

void __thiscall
QtPrivate::
QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
::~QExplicitlySharedDataPointerV2
          (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>_>
           *this)

{
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                 *)0x0) {
    LOCK();
    (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> == 0) {
      pQVar1 = (this->d).ptr;
      if (pQVar1 != (QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
                     *)0x0) {
        std::
        _Rb_tree<int,_std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>,_std::_Select1st<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>
        ::~_Rb_tree(&(pQVar1->m)._M_t);
      }
      operator_delete(pQVar1,0x38);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }